

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

st__generator * st__init_gen(st__table *table)

{
  st__generator *psVar1;
  
  psVar1 = (st__generator *)malloc(0x18);
  if (psVar1 != (st__generator *)0x0) {
    psVar1->table = table;
    psVar1->entry = (st__table_entry *)0x0;
    psVar1->index = 0;
  }
  return psVar1;
}

Assistant:

st__generator *
 st__init_gen( st__table *table)
{
    st__generator *gen;

    gen = ABC_ALLOC( st__generator, 1);
    if (gen == NULL) {
    return NULL;
    }
    gen->table = table;
    gen->entry = NULL;
    gen->index = 0;
    return gen;
}